

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::OurReader::readComment(OurReader *this)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  CommentPlacement placement;
  bool local_29;
  
  pcVar1 = this->current_;
  if (pcVar1 == this->end_) {
LAB_004f003f:
    bVar3 = false;
  }
  else {
    this->current_ = pcVar1 + 1;
    local_29 = false;
    if (*pcVar1 == '*') {
      bVar3 = readCStyleComment(this,&local_29);
      bVar2 = false;
      if (!bVar3) {
        return false;
      }
    }
    else {
      if (*pcVar1 != '/') goto LAB_004f003f;
      readCppStyleComment(this);
      bVar2 = true;
    }
    bVar3 = true;
    if (this->collectComments_ == true) {
      placement = commentBefore;
      if ((((this->lastValueHasAComment_ == false) && (this->lastValueEnd_ != (Location)0x0)) &&
          (bVar4 = containsNewLine(this->lastValueEnd_,pcVar1 + -1), placement = commentBefore,
          !bVar4)) && ((bVar2 || (local_29 == false)))) {
        this->lastValueHasAComment_ = true;
        placement = commentAfterOnSameLine;
      }
      addComment(this,pcVar1 + -1,this->current_,placement);
    }
  }
  return bVar3;
}

Assistant:

bool OurReader::readComment() {
  const Location commentBegin = current_ - 1;
  const Char c = getNextChar();
  bool successful = false;
  bool cStyleWithEmbeddedNewline = false;

  const bool isCStyleComment = (c == '*');
  const bool isCppStyleComment = (c == '/');
  if (isCStyleComment) {
    successful = readCStyleComment(&cStyleWithEmbeddedNewline);
  } else if (isCppStyleComment) {
    successful = readCppStyleComment();
  }

  if (!successful)
    return false;

  if (collectComments_) {
    CommentPlacement placement = commentBefore;

    if (!lastValueHasAComment_) {
      if (lastValueEnd_ && !containsNewLine(lastValueEnd_, commentBegin)) {
        if (isCppStyleComment || !cStyleWithEmbeddedNewline) {
          placement = commentAfterOnSameLine;
          lastValueHasAComment_ = true;
        }
      }
    }

    addComment(commentBegin, current_, placement);
  }
  return true;
}